

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickManager.cpp
# Opt level: O0

void __thiscall sf::priv::JoystickManager::~JoystickManager(JoystickManager *this)

{
  int in_ESI;
  Item *in_RDI;
  Item *pIVar1;
  Item *pIVar2;
  int i;
  int local_c;
  
  pIVar1 = in_RDI;
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    if ((in_RDI[local_c].state.connected & 1U) != 0) {
      pIVar1 = in_RDI + local_c;
      JoystickImpl::close(&pIVar1->joystick,in_ESI);
    }
  }
  JoystickImpl::cleanup((EVP_PKEY_CTX *)pIVar1);
  pIVar1 = in_RDI + 8;
  do {
    pIVar2 = pIVar1 + -1;
    Item::~Item(pIVar1);
    pIVar1 = pIVar2;
  } while (pIVar2 != in_RDI);
  NonCopyable::~NonCopyable((NonCopyable *)in_RDI);
  return;
}

Assistant:

JoystickManager::~JoystickManager()
{
    for (int i = 0; i < Joystick::Count; ++i)
    {
        if (m_joysticks[i].state.connected)
            m_joysticks[i].joystick.close();
    }

    JoystickImpl::cleanup();
}